

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemapping.cpp
# Opt level: O0

bool __thiscall myutils::FileMapping::open_file(FileMapping *this,string *filename,bool read_only)

{
  int iVar1;
  int __prot;
  char *pcVar2;
  char *p;
  int prot;
  int fd;
  int flag;
  stat st;
  bool read_only_local;
  string *filename_local;
  FileMapping *this_local;
  
  st.__glibc_reserved[2]._7_1_ = read_only;
  std::__cxx11::string::operator=((string *)&this->m_id,(string *)filename);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,(stat *)&fd);
  if (iVar1 == 0) {
    if (st.st_rdev == 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = 2;
      if ((st.__glibc_reserved[2]._7_1_ & 1) != 0) {
        iVar1 = 0;
      }
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = open(pcVar2,iVar1);
      if (iVar1 == -1) {
        this_local._7_1_ = false;
      }
      else {
        __prot = 3;
        if ((st.__glibc_reserved[2]._7_1_ & 1) != 0) {
          __prot = 1;
        }
        pcVar2 = (char *)mmap((void *)0x0,st.st_rdev,__prot,1,iVar1,0);
        if (pcVar2 == (char *)0xffffffffffffffff) {
          ::close(iVar1);
          this_local._7_1_ = false;
        }
        else {
          this->m_pMapAddress = pcVar2;
          if (0xfffffffe < (long)st.st_rdev) {
            __assert_fail("st.st_size < UINT32_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/filemapping.cpp"
                          ,0x14d,"bool myutils::FileMapping::open_file(const string &, bool)");
          }
          this->m_fd = iVar1;
          this->m_filesize = (uint32_t)st.st_rdev;
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FileMapping::open_file(const string& filename, bool read_only)
{
    m_id = filename;
    struct stat st;
    if (stat(filename.c_str(), &st)) {
        // LOG(ERROR) <<"Can't stat " << filename <<", error=" << strerror(errno);
        return false;     
    }
    if (st.st_size == 0) {
        // LOG(ERROR) <<"Wrong file size " << filename <<", size=" << st.st_size;
        return false;
    }

    int flag = read_only? O_RDONLY : O_RDWR;
    int fd = ::open(filename.c_str(), flag);
    if ( fd == -1) {
        // LOG(ERROR) <<"Can't open " << filename <<", error=" << strerror(errno);
        return false;
    }

    int prot = read_only ? PROT_READ : (PROT_READ|PROT_WRITE);
    char * p  = (char*)mmap(nullptr, st.st_size, prot, MAP_SHARED, fd, 0);
    if (p != MAP_FAILED) {
        m_pMapAddress = p;
        assert(st.st_size < UINT32_MAX);// << "Only support 4G memory file";
        m_fd = fd;
        m_filesize = static_cast<uint32_t>(st.st_size);
        return true;
    } else {
        ::close(fd);
        return false;
    }
}